

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
::intersect(BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 *puVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 *puVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  undefined8 *puVar24;
  float *pfVar25;
  Collider CVar26;
  int iVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 (*pauVar32) [16];
  int iVar33;
  AABBNodeMB4D *node1;
  ulong uVar34;
  uint *puVar35;
  undefined4 uVar36;
  ulong uVar37;
  undefined4 uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  byte *pbVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar98;
  float fVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar99;
  float fVar101;
  float fVar102;
  undefined1 auVar97 [16];
  float fVar103;
  float fVar104;
  float fVar114;
  float fVar116;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar115;
  float fVar117;
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar119;
  float fVar123;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar130;
  undefined1 auVar127 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar137 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar161 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1279;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  ulong local_1260;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  RayHit *local_1240;
  undefined1 local_1238 [12];
  float fStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  Intersectors *local_1220;
  long local_1218;
  int local_120c;
  undefined1 local_1208 [16];
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  undefined8 local_11e8;
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [8];
  uint uStack_11d0;
  uint uStack_11cc;
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  ulong local_1178;
  undefined1 (*local_1170) [16];
  long local_1168;
  long local_1160;
  int *local_1158;
  ulong local_1150;
  uint *local_1148;
  Intersectors *local_1140;
  float *local_1138;
  undefined4 local_1130;
  float local_1128;
  float local_1124;
  float local_1120;
  undefined4 local_111c;
  float local_1118;
  undefined4 local_1114;
  uint local_1110;
  uint local_110c;
  uint local_1108;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined1 local_10c8 [12];
  float fStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 *local_1098;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  float local_1028 [4];
  uint local_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_1170 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    fVar142 = *(float *)&This->ptr;
    fVar130 = *(float *)((long)&This->ptr + 4);
    fVar159 = *(float *)&This->leafIntersector;
    fVar153 = *(float *)((long)&This->leafIntersector + 4);
    CVar26 = This->collider;
    fVar67 = 0.0;
    if (0.0 <= fVar153) {
      fVar67 = fVar153;
    }
    fVar153 = *(float *)&(This->intersector1).intersect;
    fVar75 = 0.0;
    if (0.0 <= fVar153) {
      fVar75 = fVar153;
    }
    uVar54 = -(uint)(1e-18 <= ABS(CVar26.collide._0_4_));
    uVar56 = -(uint)(1e-18 <= ABS(CVar26.collide._4_4_));
    uVar60 = -(uint)(1e-18 <= ABS(CVar26.name._0_4_));
    auVar105 = divps(_DAT_01f46a60,(undefined1  [16])CVar26);
    fVar145 = (float)(~uVar54 & 0x5d5e0b6b | auVar105._0_4_ & uVar54);
    fVar147 = (float)(~uVar56 & 0x5d5e0b6b | auVar105._4_4_ & uVar56);
    fVar149 = (float)(~uVar60 & 0x5d5e0b6b | auVar105._8_4_ & uVar60);
    fVar152 = fVar145 * 0.99999964;
    fVar155 = fVar147 * 0.99999964;
    fVar157 = fVar149 * 0.99999964;
    fVar145 = fVar145 * 1.0000004;
    fVar147 = fVar147 * 1.0000004;
    fVar149 = fVar149 * 1.0000004;
    local_f98._4_4_ = fVar147;
    local_f98._0_4_ = fVar147;
    fStack_f90 = fVar147;
    fStack_f8c = fVar147;
    uVar37 = (ulong)(fVar152 < 0.0) << 4;
    uVar44 = (ulong)(fVar155 < 0.0) << 4 | 0x20;
    uVar50 = (ulong)(fVar157 < 0.0) << 4 | 0x40;
    uVar51 = uVar37 ^ 0x10;
    uVar40 = uVar44 ^ 0x10;
    auVar105._4_4_ = fVar67;
    auVar105._0_4_ = fVar67;
    auVar105._8_4_ = fVar67;
    auVar105._12_4_ = fVar67;
    auVar88._4_4_ = fVar75;
    auVar88._0_4_ = fVar75;
    auVar88._8_4_ = fVar75;
    auVar88._12_4_ = fVar75;
    _local_1018 = mm_lookupmask_ps._240_8_;
    _uStack_1010 = mm_lookupmask_ps._248_8_;
    local_fa8 = fVar159;
    fStack_fa4 = fVar159;
    fStack_fa0 = fVar159;
    fStack_f9c = fVar159;
    local_fb8 = auVar105;
    local_fc8 = fVar149;
    fStack_fc4 = fVar149;
    fStack_fc0 = fVar149;
    fStack_fbc = fVar149;
    local_fd8 = fVar157;
    fStack_fd4 = fVar157;
    fStack_fd0 = fVar157;
    fStack_fcc = fVar157;
    local_fe8 = fVar142;
    fStack_fe4 = fVar142;
    fStack_fe0 = fVar142;
    fStack_fdc = fVar142;
    local_ff8 = fVar130;
    fStack_ff4 = fVar130;
    fStack_ff0 = fVar130;
    fStack_fec = fVar130;
    local_1178 = uVar37;
    local_1008 = fVar152;
    fStack_1004 = fVar152;
    fStack_1000 = fVar152;
    fStack_ffc = fVar152;
    local_10e8 = fVar155;
    fStack_10e4 = fVar155;
    fStack_10e0 = fVar155;
    fStack_10dc = fVar155;
    local_10f8 = fVar145;
    fStack_10f4 = fVar145;
    fStack_10f0 = fVar145;
    fStack_10ec = fVar145;
    fVar67 = fVar130;
    fVar75 = fVar130;
    fVar147 = fVar130;
    fVar83 = fVar152;
    fVar91 = fVar152;
    fVar92 = fVar152;
    fVar93 = fVar155;
    fVar98 = fVar155;
    fVar99 = fVar155;
    fVar100 = fVar145;
    fVar101 = fVar145;
    fVar102 = fVar145;
    fVar103 = fVar159;
    fVar104 = fVar159;
    fVar114 = fVar159;
    fVar115 = fVar149;
    fVar116 = fVar149;
    fVar117 = fVar149;
    fVar118 = fVar157;
    fVar119 = fVar157;
    fVar123 = fVar157;
    fVar128 = fVar142;
    fVar129 = fVar142;
    fVar131 = fVar142;
    local_1260 = uVar44;
    local_1240 = ray;
    local_1220 = This;
LAB_005781b3:
    if (local_1170 != (undefined1 (*) [16])&local_f78) {
      pauVar32 = local_1170 + -1;
      local_1170 = local_1170 + -1;
      if (*(float *)((long)*pauVar32 + 8) <= fVar153) {
        uVar39 = *(ulong *)*local_1170;
        while ((uVar39 & 8) == 0) {
          fVar132 = *(float *)((long)&(This->collider).name + 4);
          fVar153 = *(float *)&(This->intersector1).intersect;
          uVar34 = uVar39 & 0xfffffffffffffff0;
          pfVar25 = (float *)(uVar34 + 0x80 + uVar37);
          pfVar23 = (float *)(uVar34 + 0x20 + uVar37);
          auVar94._0_4_ = ((*pfVar25 * fVar132 + *pfVar23) - fVar142) * fVar152;
          auVar94._4_4_ = ((pfVar25[1] * fVar132 + pfVar23[1]) - fVar128) * fVar83;
          auVar94._8_4_ = ((pfVar25[2] * fVar132 + pfVar23[2]) - fVar129) * fVar91;
          auVar94._12_4_ = ((pfVar25[3] * fVar132 + pfVar23[3]) - fVar131) * fVar92;
          auVar94 = maxps(auVar105,auVar94);
          pfVar25 = (float *)(uVar34 + 0x80 + uVar44);
          pfVar23 = (float *)(uVar34 + 0x20 + uVar44);
          auVar106._0_4_ = ((*pfVar25 * fVar132 + *pfVar23) - fVar130) * fVar155;
          auVar106._4_4_ = ((pfVar25[1] * fVar132 + pfVar23[1]) - fVar67) * fVar93;
          auVar106._8_4_ = ((pfVar25[2] * fVar132 + pfVar23[2]) - fVar75) * fVar98;
          auVar106._12_4_ = ((pfVar25[3] * fVar132 + pfVar23[3]) - fVar147) * fVar99;
          pfVar25 = (float *)(uVar34 + 0x80 + uVar50);
          pfVar23 = (float *)(uVar34 + 0x20 + uVar50);
          auVar110._0_4_ = ((*pfVar25 * fVar132 + *pfVar23) - fVar159) * fVar157;
          auVar110._4_4_ = ((pfVar25[1] * fVar132 + pfVar23[1]) - fVar103) * fVar118;
          auVar110._8_4_ = ((pfVar25[2] * fVar132 + pfVar23[2]) - fVar104) * fVar119;
          auVar110._12_4_ = ((pfVar25[3] * fVar132 + pfVar23[3]) - fVar114) * fVar123;
          auVar106 = maxps(auVar106,auVar110);
          _local_10c8 = maxps(auVar94,auVar106);
          pfVar25 = (float *)(uVar34 + 0x80 + uVar51);
          pfVar23 = (float *)(uVar34 + 0x20 + uVar51);
          auVar121._0_4_ = ((*pfVar25 * fVar132 + *pfVar23) - fVar142) * fVar145;
          auVar121._4_4_ = ((pfVar25[1] * fVar132 + pfVar23[1]) - fVar128) * fVar100;
          auVar121._8_4_ = ((pfVar25[2] * fVar132 + pfVar23[2]) - fVar129) * fVar101;
          auVar121._12_4_ = ((pfVar25[3] * fVar132 + pfVar23[3]) - fVar131) * fVar102;
          auVar94 = minps(auVar88,auVar121);
          pfVar25 = (float *)(uVar34 + 0x80 + uVar40);
          pfVar23 = (float *)(uVar34 + 0x20 + uVar40);
          auVar126._0_4_ = ((*pfVar25 * fVar132 + *pfVar23) - fVar130) * (float)local_f98._0_4_;
          auVar126._4_4_ = ((pfVar25[1] * fVar132 + pfVar23[1]) - fVar67) * (float)local_f98._4_4_;
          auVar126._8_4_ = ((pfVar25[2] * fVar132 + pfVar23[2]) - fVar75) * fStack_f90;
          auVar126._12_4_ = ((pfVar25[3] * fVar132 + pfVar23[3]) - fVar147) * fStack_f8c;
          pfVar25 = (float *)(uVar34 + 0x80 + (uVar50 ^ 0x10));
          pfVar23 = (float *)(uVar34 + 0x20 + (uVar50 ^ 0x10));
          auVar124._0_4_ = ((*pfVar25 * fVar132 + *pfVar23) - fVar159) * fVar149;
          auVar124._4_4_ = ((pfVar25[1] * fVar132 + pfVar23[1]) - fVar103) * fVar115;
          auVar124._8_4_ = ((pfVar25[2] * fVar132 + pfVar23[2]) - fVar104) * fVar116;
          auVar124._12_4_ = ((pfVar25[3] * fVar132 + pfVar23[3]) - fVar114) * fVar117;
          auVar106 = minps(auVar126,auVar124);
          auVar94 = minps(auVar94,auVar106);
          if (((uint)uVar39 & 7) == 6) {
            bVar28 = (fVar132 < *(float *)(uVar34 + 0xf0) && *(float *)(uVar34 + 0xe0) <= fVar132)
                     && local_10c8._0_4_ <= auVar94._0_4_;
            bVar29 = (fVar132 < *(float *)(uVar34 + 0xf4) && *(float *)(uVar34 + 0xe4) <= fVar132)
                     && local_10c8._4_4_ <= auVar94._4_4_;
            bVar30 = (fVar132 < *(float *)(uVar34 + 0xf8) && *(float *)(uVar34 + 0xe8) <= fVar132)
                     && local_10c8._8_4_ <= auVar94._8_4_;
            bVar31 = (fVar132 < *(float *)(uVar34 + 0xfc) && *(float *)(uVar34 + 0xec) <= fVar132)
                     && local_10c8._12_4_ <= auVar94._12_4_;
          }
          else {
            bVar28 = local_10c8._0_4_ <= auVar94._0_4_;
            bVar29 = local_10c8._4_4_ <= auVar94._4_4_;
            bVar30 = local_10c8._8_4_ <= auVar94._8_4_;
            bVar31 = local_10c8._12_4_ <= auVar94._12_4_;
          }
          auVar84._0_4_ = (uint)bVar28 * -0x80000000;
          auVar84._4_4_ = (uint)bVar29 * -0x80000000;
          auVar84._8_4_ = (uint)bVar30 * -0x80000000;
          auVar84._12_4_ = (uint)bVar31 * -0x80000000;
          uVar54 = movmskps((int)context,auVar84);
          context = (RayQueryContext *)(ulong)uVar54;
          if (uVar54 == 0) goto LAB_005781b3;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar54 != 0) {
            for (; ((byte)uVar54 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar39 = *(ulong *)(uVar34 + (long)context * 8);
          uVar54 = (uVar54 & 0xff) - 1 & uVar54 & 0xff;
          if (uVar54 != 0) {
            uVar56 = *(uint *)(local_10c8 + (long)context * 4);
            lVar53 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            uVar41 = *(ulong *)(uVar34 + lVar53 * 8);
            uVar60 = *(uint *)(local_10c8 + lVar53 * 4);
            uVar54 = uVar54 - 1 & uVar54;
            context = (RayQueryContext *)(ulong)uVar54;
            uVar44 = local_1260;
            if (uVar54 == 0) {
              if (uVar56 < uVar60) {
                *(ulong *)*local_1170 = uVar41;
                *(uint *)((long)*local_1170 + 8) = uVar60;
                local_1170 = local_1170 + 1;
              }
              else {
                *(ulong *)*local_1170 = uVar39;
                *(uint *)((long)*local_1170 + 8) = uVar56;
                uVar39 = uVar41;
                local_1170 = local_1170 + 1;
              }
            }
            else {
              auVar76._8_4_ = uVar56;
              auVar76._0_8_ = uVar39;
              auVar76._12_4_ = 0;
              auVar85._8_4_ = uVar60;
              auVar85._0_8_ = uVar41;
              auVar85._12_4_ = 0;
              lVar53 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar54 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
              uVar39 = *(ulong *)(uVar34 + lVar53 * 8);
              iVar33 = *(int *)(local_10c8 + lVar53 * 4);
              auVar95._8_4_ = iVar33;
              auVar95._0_8_ = uVar39;
              auVar95._12_4_ = 0;
              auVar107._8_4_ = -(uint)((int)uVar56 < (int)uVar60);
              uVar54 = uVar54 - 1 & uVar54;
              if (uVar54 == 0) {
                auVar107._4_4_ = auVar107._8_4_;
                auVar107._0_4_ = auVar107._8_4_;
                auVar107._12_4_ = auVar107._8_4_;
                auVar94 = auVar76 & auVar107 | ~auVar107 & auVar85;
                auVar106 = auVar85 & auVar107 | ~auVar107 & auVar76;
                auVar108._8_4_ = -(uint)(auVar94._8_4_ < iVar33);
                auVar108._0_8_ = CONCAT44(auVar108._8_4_,auVar108._8_4_);
                auVar108._12_4_ = auVar108._8_4_;
                uVar39 = ~auVar108._0_8_ & uVar39 | auVar94._0_8_ & auVar108._0_8_;
                auVar94 = auVar95 & auVar108 | ~auVar108 & auVar94;
                auVar77._8_4_ = -(uint)(auVar106._8_4_ < auVar94._8_4_);
                auVar77._4_4_ = auVar77._8_4_;
                auVar77._0_4_ = auVar77._8_4_;
                auVar77._12_4_ = auVar77._8_4_;
                *local_1170 = ~auVar77 & auVar106 | auVar94 & auVar77;
                local_1170[1] = auVar106 & auVar77 | ~auVar77 & auVar94;
                local_1170 = local_1170 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                iVar27 = *(int *)(local_10c8 + (long)context * 4);
                auVar120._8_4_ = iVar27;
                auVar120._0_8_ = *(undefined8 *)(uVar34 + (long)context * 8);
                auVar120._12_4_ = 0;
                auVar109._4_4_ = auVar107._8_4_;
                auVar109._0_4_ = auVar107._8_4_;
                auVar109._8_4_ = auVar107._8_4_;
                auVar109._12_4_ = auVar107._8_4_;
                auVar94 = auVar76 & auVar109 | ~auVar109 & auVar85;
                auVar106 = auVar85 & auVar109 | ~auVar109 & auVar76;
                auVar125._0_4_ = -(uint)(iVar33 < iVar27);
                auVar125._4_4_ = -(uint)(iVar33 < iVar27);
                auVar125._8_4_ = -(uint)(iVar33 < iVar27);
                auVar125._12_4_ = -(uint)(iVar33 < iVar27);
                auVar110 = auVar95 & auVar125 | ~auVar125 & auVar120;
                auVar126 = ~auVar125 & auVar95 | auVar120 & auVar125;
                auVar96._8_4_ = -(uint)(auVar106._8_4_ < auVar126._8_4_);
                auVar96._4_4_ = auVar96._8_4_;
                auVar96._0_4_ = auVar96._8_4_;
                auVar96._12_4_ = auVar96._8_4_;
                auVar121 = auVar106 & auVar96 | ~auVar96 & auVar126;
                auVar86._8_4_ = -(uint)(auVar94._8_4_ < auVar110._8_4_);
                auVar86._0_8_ = CONCAT44(auVar86._8_4_,auVar86._8_4_);
                auVar86._12_4_ = auVar86._8_4_;
                uVar39 = auVar94._0_8_ & auVar86._0_8_ | ~auVar86._0_8_ & auVar110._0_8_;
                auVar94 = ~auVar86 & auVar94 | auVar110 & auVar86;
                auVar78._8_4_ = -(uint)(auVar94._8_4_ < auVar121._8_4_);
                auVar78._4_4_ = auVar78._8_4_;
                auVar78._0_4_ = auVar78._8_4_;
                auVar78._12_4_ = auVar78._8_4_;
                *local_1170 = ~auVar96 & auVar106 | auVar126 & auVar96;
                local_1170[1] = ~auVar78 & auVar94 | auVar121 & auVar78;
                local_1170[2] = auVar94 & auVar78 | ~auVar78 & auVar121;
                local_1170 = local_1170 + 3;
                fVar155 = local_10e8;
                fVar93 = fStack_10e4;
                fVar98 = fStack_10e0;
                fVar99 = fStack_10dc;
                fVar145 = local_10f8;
                fVar100 = fStack_10f4;
                fVar101 = fStack_10f0;
                fVar102 = fStack_10ec;
              }
            }
          }
        }
        local_1168 = (ulong)((uint)uVar39 & 0xf) - 8;
        uVar39 = uVar39 & 0xfffffffffffffff0;
        for (local_1160 = 0; local_1160 != local_1168; local_1160 = local_1160 + 1) {
          local_1208._0_8_ = local_1160 * 0x50;
          local_1218 = *(long *)&(local_1240->super_RayK<1>).org.field_0;
          lVar53 = *(long *)(*(long *)(local_1218 + 0x1e8) +
                            (ulong)*(uint *)(uVar39 + 0x30 + local_1160 * 0x50) * 8);
          local_1258 = *(float *)(lVar53 + 0x28);
          fVar67 = ((*(float *)((long)&(This->collider).name + 4) - *(float *)(lVar53 + 0x2c)) /
                   (*(float *)(lVar53 + 0x30) - *(float *)(lVar53 + 0x2c))) * local_1258;
          _local_1278 = ZEXT416((uint)fVar67);
          fVar67 = floorf(fVar67);
          auVar105 = local_1208;
          if (local_1258 + -1.0 <= fVar67) {
            fVar67 = local_1258 + -1.0;
          }
          fVar142 = 0.0;
          if (0.0 <= fVar67) {
            fVar142 = fVar67;
          }
          uVar49 = (ulong)*(uint *)(uVar39 + 4 + local_1208._0_8_);
          lVar43 = *(long *)(*(long *)(lVar53 + 0xe0) + (long)(int)fVar142 * 0x38);
          lVar53 = *(long *)(*(long *)(lVar53 + 0xe0) + 0x38 + (long)(int)fVar142 * 0x38);
          pfVar23 = (float *)(lVar43 + (ulong)*(uint *)(uVar39 + local_1208._0_8_) * 4);
          uVar37 = (ulong)*(uint *)(uVar39 + 0x10 + local_1208._0_8_);
          pfVar25 = (float *)(lVar43 + uVar37 * 4);
          uVar34 = (ulong)*(uint *)(uVar39 + 0x20 + local_1208._0_8_);
          pfVar1 = (float *)(lVar43 + uVar34 * 4);
          pfVar2 = (float *)(lVar43 + uVar49 * 4);
          uVar44 = (ulong)*(uint *)(uVar39 + 0x14 + local_1208._0_8_);
          pfVar3 = (float *)(lVar43 + uVar44 * 4);
          uVar41 = (ulong)*(uint *)(uVar39 + 0x24 + local_1208._0_8_);
          pfVar4 = (float *)(lVar43 + uVar41 * 4);
          uVar42 = (ulong)*(uint *)(uVar39 + 8 + local_1208._0_8_);
          pfVar5 = (float *)(lVar43 + uVar42 * 4);
          uVar48 = (ulong)*(uint *)(uVar39 + 0x18 + local_1208._0_8_);
          puVar6 = (undefined4 *)(lVar43 + uVar48 * 4);
          uStack_1228 = *puVar6;
          uVar45 = (ulong)*(uint *)(uVar39 + 0x28 + local_1208._0_8_);
          pfVar7 = (float *)(lVar43 + uVar45 * 4);
          uVar46 = (ulong)*(uint *)(uVar39 + 0xc + local_1208._0_8_);
          pfVar8 = (float *)(lVar43 + uVar46 * 4);
          uVar54 = *(uint *)(uVar39 + 0x1c + local_1208._0_8_);
          context = (RayQueryContext *)(ulong)uVar54;
          local_11c8 = context;
          puVar9 = (undefined4 *)(lVar43 + (long)context * 4);
          uStack_1224 = *puVar9;
          uVar52 = (ulong)*(uint *)(uVar39 + 0x2c + local_1208._0_8_);
          pfVar10 = (float *)(lVar43 + uVar52 * 4);
          pfVar11 = (float *)(lVar53 + (ulong)*(uint *)(uVar39 + local_1208._0_8_) * 4);
          pfVar12 = (float *)(lVar53 + uVar37 * 4);
          fVar142 = (float)local_1278._0_4_ - fVar142;
          pfVar13 = (float *)(lVar53 + uVar49 * 4);
          local_11d8._4_4_ = pfVar8[2];
          local_11d8._0_4_ = pfVar5[2];
          pfVar14 = (float *)(lVar53 + uVar42 * 4);
          pfVar15 = (float *)(lVar53 + uVar46 * 4);
          local_11b8 = pfVar1[2];
          fStack_11b4 = pfVar4[2];
          fStack_11b0 = pfVar7[2];
          fStack_11ac = pfVar10[2];
          pfVar16 = (float *)(lVar53 + uVar48 * 4);
          pfVar17 = (float *)(lVar53 + uVar44 * 4);
          pfVar18 = (float *)(lVar53 + (long)context * 4);
          pfVar19 = (float *)(lVar53 + uVar34 * 4);
          pfVar20 = (float *)(lVar53 + uVar45 * 4);
          pfVar21 = (float *)(lVar53 + uVar41 * 4);
          pfVar22 = (float *)(lVar53 + uVar52 * 4);
          fVar153 = 1.0 - fVar142;
          puVar24 = (undefined8 *)(uVar39 + 0x30 + local_1208._0_8_);
          local_f88 = *puVar24;
          uStack_f80 = puVar24[1];
          puVar24 = (undefined8 *)(uVar39 + 0x40 + local_1208._0_8_);
          local_10d8 = *puVar24;
          uStack_10d0 = puVar24[1];
          fVar67 = *(float *)&local_1220->ptr;
          fVar130 = *(float *)((long)&local_1220->ptr + 4);
          fVar159 = *(float *)&local_1220->leafIntersector;
          fVar91 = (*pfVar23 * fVar153 + *pfVar11 * fVar142) - fVar67;
          fVar98 = (*pfVar2 * fVar153 + *pfVar13 * fVar142) - fVar67;
          fVar100 = (*pfVar5 * fVar153 + *pfVar14 * fVar142) - fVar67;
          fVar102 = (*pfVar8 * fVar153 + *pfVar15 * fVar142) - fVar67;
          fVar143 = (pfVar23[1] * fVar153 + pfVar11[1] * fVar142) - fVar130;
          fVar144 = (pfVar2[1] * fVar153 + pfVar13[1] * fVar142) - fVar130;
          fStack_1180 = (pfVar5[1] * fVar153 + pfVar14[1] * fVar142) - fVar130;
          fStack_117c = (pfVar8[1] * fVar153 + pfVar15[1] * fVar142) - fVar130;
          fVar172 = (pfVar23[2] * fVar153 + pfVar11[2] * fVar142) - fVar159;
          fVar174 = (pfVar2[2] * fVar153 + pfVar13[2] * fVar142) - fVar159;
          fStack_11e0 = (fStack_11e0 * fVar153 + pfVar14[2] * fVar142) - fVar159;
          fStack_11dc = (fStack_11dc * fVar153 + pfVar15[2] * fVar142) - fVar159;
          fVar103 = (*pfVar25 * fVar153 + *pfVar12 * fVar142) - fVar67;
          fVar114 = (*pfVar3 * fVar153 + *pfVar17 * fVar142) - fVar67;
          fVar116 = ((float)local_1238._8_4_ * fVar153 + *pfVar16 * fVar142) - fVar67;
          fVar149 = (fStack_122c * fVar153 + *pfVar18 * fVar142) - fVar67;
          fVar135 = (pfVar25[1] * fVar153 + pfVar12[1] * fVar142) - fVar130;
          fVar138 = (pfVar3[1] * fVar153 + pfVar17[1] * fVar142) - fVar130;
          fVar140 = ((float)puVar6[1] * fVar153 + pfVar16[1] * fVar142) - fVar130;
          fVar141 = ((float)puVar9[1] * fVar153 + pfVar18[1] * fVar142) - fVar130;
          fVar164 = (pfVar25[2] * fVar153 + pfVar12[2] * fVar142) - fVar159;
          fVar166 = (pfVar3[2] * fVar153 + pfVar17[2] * fVar142) - fVar159;
          fVar168 = ((float)puVar6[2] * fVar153 + pfVar16[2] * fVar142) - fVar159;
          fVar170 = ((float)puVar9[2] * fVar153 + pfVar18[2] * fVar142) - fVar159;
          fVar160 = (*pfVar1 * fVar153 + *pfVar19 * fVar142) - fVar67;
          fVar162 = (*pfVar4 * fVar153 + *pfVar21 * fVar142) - fVar67;
          fVar163 = (*pfVar7 * fVar153 + *pfVar20 * fVar142) - fVar67;
          fVar67 = (*pfVar10 * fVar153 + *pfVar22 * fVar142) - fVar67;
          fVar157 = (pfVar1[1] * fVar153 + pfVar19[1] * fVar142) - fVar130;
          fVar128 = (pfVar4[1] * fVar153 + pfVar21[1] * fVar142) - fVar130;
          fVar129 = (pfVar7[1] * fVar153 + pfVar20[1] * fVar142) - fVar130;
          fVar130 = (pfVar10[1] * fVar153 + pfVar22[1] * fVar142) - fVar130;
          fVar154 = (fVar153 * pfVar1[2] + fVar142 * pfVar19[2]) - fVar159;
          fVar156 = (fVar153 * pfVar4[2] + fVar142 * pfVar21[2]) - fVar159;
          fVar158 = (fVar153 * pfVar7[2] + fVar142 * pfVar20[2]) - fVar159;
          fVar159 = (fVar153 * pfVar10[2] + fVar142 * pfVar22[2]) - fVar159;
          fVar104 = fVar160 - fVar91;
          fVar115 = fVar162 - fVar98;
          fVar117 = fVar163 - fVar100;
          fVar118 = fVar67 - fVar102;
          fVar119 = fVar157 - fVar143;
          fVar123 = fVar128 - fVar144;
          fStack_11a0 = fVar129 - fStack_1180;
          fStack_119c = fVar130 - fStack_117c;
          fVar92 = fVar154 - fVar172;
          fVar99 = fVar156 - fVar174;
          fStack_1190 = fVar158 - fStack_11e0;
          fStack_118c = fVar159 - fStack_11dc;
          _local_1198 = CONCAT44(fVar99,fVar92);
          _local_11a8 = CONCAT44(fVar123,fVar119);
          local_11f8._4_4_ = fVar115;
          local_11f8._0_4_ = fVar104;
          fStack_11f0 = fVar117;
          fStack_11ec = fVar118;
          fVar142 = *(float *)&(local_1220->collider).collide;
          fVar153 = *(float *)((long)&(local_1220->collider).collide + 4);
          fStack_1254 = *(float *)&(local_1220->collider).name;
          fVar136 = (fVar119 * (fVar154 + fVar172) - fVar92 * (fVar157 + fVar143)) * fVar142 +
                    (fVar92 * (fVar160 + fVar91) - (fVar154 + fVar172) * fVar104) * fVar153 +
                    ((fVar157 + fVar143) * fVar104 - (fVar160 + fVar91) * fVar119) * fStack_1254;
          fVar139 = (fVar123 * (fVar156 + fVar174) - fVar99 * (fVar128 + fVar144)) * fVar142 +
                    (fVar99 * (fVar162 + fVar98) - (fVar156 + fVar174) * fVar115) * fVar153 +
                    ((fVar128 + fVar144) * fVar115 - (fVar162 + fVar98) * fVar123) * fStack_1254;
          local_1208._0_8_ = CONCAT44(fVar139,fVar136);
          local_1208._8_4_ =
               (fStack_11a0 * (fVar158 + fStack_11e0) - fStack_1190 * (fVar129 + fStack_1180)) *
               fVar142 + (fStack_1190 * (fVar163 + fVar100) - (fVar158 + fStack_11e0) * fVar117) *
                         fVar153 + ((fVar129 + fStack_1180) * fVar117 -
                                   (fVar163 + fVar100) * fStack_11a0) * fStack_1254;
          local_1208._12_4_ =
               (fStack_119c * (fVar159 + fStack_11dc) - fStack_118c * (fVar130 + fStack_117c)) *
               fVar142 + (fStack_118c * (fVar67 + fVar102) - (fVar159 + fStack_11dc) * fVar118) *
                         fVar153 + ((fVar130 + fStack_117c) * fVar118 -
                                   (fVar67 + fVar102) * fStack_119c) * fStack_1254;
          fVar131 = fVar143 - fVar135;
          fVar132 = fVar144 - fVar138;
          fVar133 = fStack_1180 - fVar140;
          fVar134 = fStack_117c - fVar141;
          fVar146 = fVar172 - fVar164;
          fVar148 = fVar174 - fVar166;
          fVar150 = fStack_11e0 - fVar168;
          fVar151 = fStack_11dc - fVar170;
          _local_1188 = CONCAT44(fVar144,fVar143);
          local_11e8 = CONCAT44(fVar174,fVar172);
          fVar173 = fVar91 - fVar103;
          fVar175 = fVar98 - fVar114;
          fVar176 = fVar100 - fVar116;
          fVar177 = fVar102 - fVar149;
          local_1238._0_4_ =
               (fVar131 * (fVar172 + fVar164) - fVar146 * (fVar143 + fVar135)) * fVar142 +
               (fVar146 * (fVar91 + fVar103) - (fVar172 + fVar164) * fVar173) * fVar153 +
               ((fVar143 + fVar135) * fVar173 - (fVar91 + fVar103) * fVar131) * fStack_1254;
          local_1238._4_4_ =
               (fVar132 * (fVar174 + fVar166) - fVar148 * (fVar144 + fVar138)) * fVar142 +
               (fVar148 * (fVar98 + fVar114) - (fVar174 + fVar166) * fVar175) * fVar153 +
               ((fVar144 + fVar138) * fVar175 - (fVar98 + fVar114) * fVar132) * fStack_1254;
          local_1238._8_4_ =
               (fVar133 * (fStack_11e0 + fVar168) - fVar150 * (fStack_1180 + fVar140)) * fVar142 +
               (fVar150 * (fVar100 + fVar116) - (fStack_11e0 + fVar168) * fVar176) * fVar153 +
               ((fStack_1180 + fVar140) * fVar176 - (fVar100 + fVar116) * fVar133) * fStack_1254;
          fStack_122c = (fVar134 * (fStack_11dc + fVar170) - fVar151 * (fStack_117c + fVar141)) *
                        fVar142 + (fVar151 * (fVar102 + fVar149) - (fStack_11dc + fVar170) * fVar177
                                  ) * fVar153 +
                                  ((fStack_117c + fVar141) * fVar177 - (fVar102 + fVar149) * fVar134
                                  ) * fStack_1254;
          fVar75 = fVar103 - fVar160;
          fVar147 = fVar114 - fVar162;
          fVar152 = fVar116 - fVar163;
          fVar83 = fVar149 - fVar67;
          fVar165 = fVar135 - fVar157;
          fVar167 = fVar138 - fVar128;
          fVar169 = fVar140 - fVar129;
          fVar171 = fVar141 - fVar130;
          fVar93 = fVar164 - fVar154;
          fVar155 = fVar166 - fVar156;
          fVar101 = fVar168 - fVar158;
          fVar145 = fVar170 - fVar159;
          auVar68._0_4_ =
               (fVar165 * (fVar154 + fVar164) - fVar93 * (fVar157 + fVar135)) * fVar142 +
               (fVar93 * (fVar160 + fVar103) - (fVar154 + fVar164) * fVar75) * fVar153 +
               ((fVar157 + fVar135) * fVar75 - (fVar160 + fVar103) * fVar165) * fStack_1254;
          auVar68._4_4_ =
               (fVar167 * (fVar156 + fVar166) - fVar155 * (fVar128 + fVar138)) * fVar142 +
               (fVar155 * (fVar162 + fVar114) - (fVar156 + fVar166) * fVar147) * fVar153 +
               ((fVar128 + fVar138) * fVar147 - (fVar162 + fVar114) * fVar167) * fStack_1254;
          auVar68._8_4_ =
               (fVar169 * (fVar158 + fVar168) - fVar101 * (fVar129 + fVar140)) * fVar142 +
               (fVar101 * (fVar163 + fVar116) - (fVar158 + fVar168) * fVar152) * fVar153 +
               ((fVar129 + fVar140) * fVar152 - (fVar163 + fVar116) * fVar169) * fStack_1254;
          auVar68._12_4_ =
               (fVar171 * (fVar159 + fVar170) - fVar145 * (fVar130 + fVar141)) * fVar142 +
               (fVar145 * (fVar67 + fVar149) - (fVar159 + fVar170) * fVar83) * fVar153 +
               ((fVar130 + fVar141) * fVar83 - (fVar67 + fVar149) * fVar171) * fStack_1254;
          auVar127._0_4_ = fVar136 + local_1238._0_4_ + auVar68._0_4_;
          auVar127._4_4_ = fVar139 + local_1238._4_4_ + auVar68._4_4_;
          auVar127._8_4_ = local_1208._8_4_ + (float)local_1238._8_4_ + auVar68._8_4_;
          auVar127._12_4_ = local_1208._12_4_ + fStack_122c + auVar68._12_4_;
          auVar87._8_4_ = local_1208._8_4_;
          auVar87._0_8_ = local_1208._0_8_;
          auVar87._12_4_ = local_1208._12_4_;
          auVar88 = minps(auVar87,_local_1238);
          auVar88 = minps(auVar88,auVar68);
          auVar94 = maxps(local_1208,_local_1238);
          auVar94 = maxps(auVar94,auVar68);
          fVar67 = ABS(auVar127._0_4_);
          fVar130 = ABS(auVar127._4_4_);
          fVar159 = ABS(auVar127._8_4_);
          fVar103 = ABS(auVar127._12_4_);
          local_1279 = 0;
          auVar137._0_4_ =
               -(uint)(auVar94._0_4_ <= fVar67 * 1.1920929e-07 ||
                      -(fVar67 * 1.1920929e-07) <= auVar88._0_4_) & local_1018;
          auVar137._4_4_ =
               -(uint)(auVar94._4_4_ <= fVar130 * 1.1920929e-07 ||
                      -(fVar130 * 1.1920929e-07) <= auVar88._4_4_) & uStack_1014;
          auVar137._8_4_ =
               -(uint)(auVar94._8_4_ <= fVar159 * 1.1920929e-07 ||
                      -(fVar159 * 1.1920929e-07) <= auVar88._8_4_) & uStack_1010;
          auVar137._12_4_ =
               -(uint)(auVar94._12_4_ <= fVar103 * 1.1920929e-07 ||
                      -(fVar103 * 1.1920929e-07) <= auVar88._12_4_) & uStack_100c;
          iVar33 = movmskps(auVar105._0_4_,auVar137);
          This = local_1220;
          fStack_1250 = fStack_1254;
          fStack_124c = fStack_1254;
          if (iVar33 != 0) {
            local_11b8 = fVar67;
            fStack_11b4 = fVar130;
            fStack_11b0 = fVar159;
            fStack_11ac = fVar103;
            local_11c8 = (RayQueryContext *)CONCAT44(fVar167,fVar165);
            fStack_11c0 = fVar169;
            fStack_11bc = fVar171;
            _local_11f8 = auVar127;
            uVar56 = -(uint)(ABS(fVar146 * fVar165) <= ABS(fVar92 * fVar131));
            uVar57 = -(uint)(ABS(fVar148 * fVar167) <= ABS(fVar99 * fVar132));
            uVar61 = -(uint)(ABS(fVar150 * fVar169) <= ABS(fStack_1190 * fVar133));
            uVar64 = -(uint)(ABS(fVar151 * fVar171) <= ABS(fStack_118c * fVar134));
            uVar60 = -(uint)(ABS(fVar173 * fVar93) <= ABS(fVar104 * fVar146));
            uVar58 = -(uint)(ABS(fVar175 * fVar155) <= ABS(fVar115 * fVar148));
            uVar62 = -(uint)(ABS(fVar176 * fVar101) <= ABS(fVar117 * fVar150));
            uVar65 = -(uint)(ABS(fVar177 * fVar145) <= ABS(fVar118 * fVar151));
            uVar55 = -(uint)(ABS(fVar131 * fVar75) <= ABS(fVar119 * fVar173));
            uVar59 = -(uint)(ABS(fVar132 * fVar147) <= ABS(fVar123 * fVar175));
            uVar63 = -(uint)(ABS(fVar133 * fVar152) <= ABS(fStack_11a0 * fVar176));
            uVar66 = -(uint)(ABS(fVar134 * fVar83) <= ABS(fStack_119c * fVar177));
            fVar114 = (float)(~uVar56 & (uint)(fVar119 * fVar146 - fVar92 * fVar131) |
                             (uint)(fVar131 * fVar93 - fVar146 * fVar165) & uVar56);
            fVar116 = (float)(~uVar57 & (uint)(fVar123 * fVar148 - fVar99 * fVar132) |
                             (uint)(fVar132 * fVar155 - fVar148 * fVar167) & uVar57);
            fVar149 = (float)(~uVar61 & (uint)(fStack_11a0 * fVar150 - fStack_1190 * fVar133) |
                             (uint)(fVar133 * fVar101 - fVar150 * fVar169) & uVar61);
            fVar157 = (float)(~uVar64 & (uint)(fStack_119c * fVar151 - fStack_118c * fVar134) |
                             (uint)(fVar134 * fVar145 - fVar151 * fVar171) & uVar64);
            fVar93 = (float)(~uVar60 & (uint)(fVar92 * fVar173 - fVar104 * fVar146) |
                            (uint)(fVar146 * fVar75 - fVar173 * fVar93) & uVar60);
            fVar99 = (float)(~uVar58 & (uint)(fVar99 * fVar175 - fVar115 * fVar148) |
                            (uint)(fVar148 * fVar147 - fVar175 * fVar155) & uVar58);
            fVar155 = (float)(~uVar62 & (uint)(fStack_1190 * fVar176 - fVar117 * fVar150) |
                             (uint)(fVar150 * fVar152 - fVar176 * fVar101) & uVar62);
            fVar101 = (float)(~uVar65 & (uint)(fStack_118c * fVar177 - fVar118 * fVar151) |
                             (uint)(fVar151 * fVar83 - fVar177 * fVar145) & uVar65);
            fVar145 = (float)(~uVar55 & (uint)(fVar104 * fVar131 - fVar119 * fVar173) |
                             (uint)(fVar173 * fVar165 - fVar131 * fVar75) & uVar55);
            fVar104 = (float)(~uVar59 & (uint)(fVar115 * fVar132 - fVar123 * fVar175) |
                             (uint)(fVar175 * fVar167 - fVar132 * fVar147) & uVar59);
            fVar115 = (float)(~uVar63 & (uint)(fVar117 * fVar133 - fStack_11a0 * fVar176) |
                             (uint)(fVar176 * fVar169 - fVar133 * fVar152) & uVar63);
            fVar117 = (float)(~uVar66 & (uint)(fVar118 * fVar134 - fStack_119c * fVar177) |
                             (uint)(fVar177 * fVar171 - fVar134 * fVar83) & uVar66);
            fVar75 = fVar142 * fVar114 + fVar153 * fVar93 + fStack_1254 * fVar145;
            fVar147 = fVar142 * fVar116 + fVar153 * fVar99 + fStack_1254 * fVar104;
            fVar152 = fVar142 * fVar149 + fVar153 * fVar155 + fStack_1254 * fVar115;
            fVar142 = fVar142 * fVar157 + fVar153 * fVar101 + fStack_1254 * fVar117;
            auVar111._0_4_ = fVar75 + fVar75;
            auVar111._4_4_ = fVar147 + fVar147;
            auVar111._8_4_ = fVar152 + fVar152;
            auVar111._12_4_ = fVar142 + fVar142;
            auVar69._0_4_ = fVar172 * fVar145;
            auVar69._4_4_ = fVar174 * fVar104;
            auVar69._8_4_ = fStack_11e0 * fVar115;
            auVar69._12_4_ = fStack_11dc * fVar117;
            fVar152 = fVar91 * fVar114 + fVar143 * fVar93 + auVar69._0_4_;
            fVar83 = fVar98 * fVar116 + fVar144 * fVar99 + auVar69._4_4_;
            fVar91 = fVar100 * fVar149 + fStack_1180 * fVar155 + auVar69._8_4_;
            fVar92 = fVar102 * fVar157 + fStack_117c * fVar101 + auVar69._12_4_;
            auVar105 = rcpps(auVar69,auVar111);
            fVar142 = auVar105._0_4_;
            fVar153 = auVar105._4_4_;
            fVar75 = auVar105._8_4_;
            fVar147 = auVar105._12_4_;
            fVar152 = ((1.0 - auVar111._0_4_ * fVar142) * fVar142 + fVar142) * (fVar152 + fVar152);
            fVar83 = ((1.0 - auVar111._4_4_ * fVar153) * fVar153 + fVar153) * (fVar83 + fVar83);
            fVar91 = ((1.0 - auVar111._8_4_ * fVar75) * fVar75 + fVar75) * (fVar91 + fVar91);
            fVar92 = ((1.0 - auVar111._12_4_ * fVar147) * fVar147 + fVar147) * (fVar92 + fVar92);
            local_1258 = *(float *)&(local_1220->intersector1).intersect;
            fVar142 = *(float *)((long)&(local_1220->intersector1).intersect + 4);
            fVar153 = *(float *)&(local_1220->intersector1).occluded;
            fVar75 = *(float *)((long)&(local_1220->intersector1).occluded + 4);
            fVar147 = *(float *)((long)&local_1220->leafIntersector + 4);
            auVar70._4_4_ = -(uint)(fVar147 <= fVar83);
            auVar70._0_4_ = -(uint)(fVar147 <= fVar152);
            auVar70._8_4_ = -(uint)(fVar147 <= fVar91);
            auVar70._12_4_ = -(uint)(fVar147 <= fVar92);
            auVar112._0_4_ =
                 (int)((uint)(auVar111._0_4_ != 0.0 && (fVar152 <= local_1258 && fVar147 <= fVar152)
                             ) * -0x80000000) >> 0x1f;
            auVar112._4_4_ =
                 (int)((uint)(auVar111._4_4_ != 0.0 && (fVar83 <= local_1258 && fVar147 <= fVar83))
                      * -0x80000000) >> 0x1f;
            auVar112._8_4_ =
                 (int)((uint)(auVar111._8_4_ != 0.0 && (fVar91 <= local_1258 && fVar147 <= fVar91))
                      * -0x80000000) >> 0x1f;
            auVar112._12_4_ =
                 (int)((uint)(auVar111._12_4_ != 0.0 && (fVar92 <= local_1258 && fVar147 <= fVar92))
                      * -0x80000000) >> 0x1f;
            auVar113 = auVar112 & auVar137;
            iVar33 = movmskps(iVar33,auVar113);
            if (iVar33 != 0) {
              local_10c8._8_4_ = local_1208._8_4_;
              local_10c8._0_8_ = local_1208._0_8_;
              fStack_10bc = local_1208._12_4_;
              local_10b8 = _local_1238;
              local_10a8 = auVar127;
              local_1098 = &local_1279;
              local_1088 = auVar113;
              local_1058[0] = fVar152;
              local_1058[1] = fVar83;
              local_1058[2] = fVar91;
              local_1058[3] = fVar92;
              local_1048[0] = fVar114;
              local_1048[1] = fVar116;
              local_1048[2] = fVar149;
              local_1048[3] = fVar157;
              local_1038[0] = fVar93;
              local_1038[1] = fVar99;
              local_1038[2] = fVar155;
              local_1038[3] = fVar101;
              local_1028[0] = fVar145;
              local_1028[1] = fVar104;
              local_1028[2] = fVar115;
              local_1028[3] = fVar117;
              _local_11d8 = auVar113;
              auVar105 = rcpps(auVar70,auVar127);
              fVar147 = auVar105._0_4_;
              fVar93 = auVar105._4_4_;
              fVar98 = auVar105._8_4_;
              fVar99 = auVar105._12_4_;
              fVar67 = (float)(-(uint)(1e-18 <= fVar67) &
                              (uint)(((float)DAT_01f46a60 - auVar127._0_4_ * fVar147) * fVar147 +
                                    fVar147));
              fVar130 = (float)(-(uint)(1e-18 <= fVar130) &
                               (uint)((DAT_01f46a60._4_4_ - auVar127._4_4_ * fVar93) * fVar93 +
                                     fVar93));
              fVar159 = (float)(-(uint)(1e-18 <= fVar159) &
                               (uint)((DAT_01f46a60._8_4_ - auVar127._8_4_ * fVar98) * fVar98 +
                                     fVar98));
              fVar147 = (float)(-(uint)(1e-18 <= fVar103) &
                               (uint)((DAT_01f46a60._12_4_ - auVar127._12_4_ * fVar99) * fVar99 +
                                     fVar99));
              auVar122._0_4_ = fVar136 * fVar67;
              auVar122._4_4_ = fVar139 * fVar130;
              auVar122._8_4_ = local_1208._8_4_ * fVar159;
              auVar122._12_4_ = local_1208._12_4_ * fVar147;
              local_1078 = minps(auVar122,_DAT_01f46a60);
              auVar161._0_4_ = fVar67 * local_1238._0_4_;
              auVar161._4_4_ = fVar130 * local_1238._4_4_;
              auVar161._8_4_ = fVar159 * (float)local_1238._8_4_;
              auVar161._12_4_ = fVar147 * fStack_122c;
              local_1068 = minps(auVar161,_DAT_01f46a60);
              uVar56 = auVar113._0_4_;
              uVar60 = auVar113._4_4_;
              uVar55 = auVar113._8_4_;
              uVar57 = auVar113._12_4_;
              auVar71._0_4_ = uVar56 & (uint)fVar152;
              auVar71._4_4_ = uVar60 & (uint)fVar83;
              auVar71._8_4_ = uVar55 & (uint)fVar91;
              auVar71._12_4_ = uVar57 & (uint)fVar92;
              auVar79._0_8_ = CONCAT44(~uVar60,~uVar56) & 0x7f8000007f800000;
              auVar79._8_4_ = ~uVar55 & 0x7f800000;
              auVar79._12_4_ = ~uVar57 & 0x7f800000;
              auVar79 = auVar79 | auVar71;
              auVar89._4_4_ = auVar79._0_4_;
              auVar89._0_4_ = auVar79._4_4_;
              auVar89._8_4_ = auVar79._12_4_;
              auVar89._12_4_ = auVar79._8_4_;
              auVar105 = minps(auVar89,auVar79);
              auVar72._0_8_ = auVar105._8_8_;
              auVar72._8_4_ = auVar105._0_4_;
              auVar72._12_4_ = auVar105._4_4_;
              auVar105 = minps(auVar72,auVar105);
              auVar73._0_8_ =
                   CONCAT44(-(uint)(auVar105._4_4_ == auVar79._4_4_) & uVar60,
                            -(uint)(auVar105._0_4_ == auVar79._0_4_) & uVar56);
              auVar73._8_4_ = -(uint)(auVar105._8_4_ == auVar79._8_4_) & uVar55;
              auVar73._12_4_ = -(uint)(auVar105._12_4_ == auVar79._12_4_) & uVar57;
              iVar33 = movmskps((int)&local_1279,auVar73);
              if (iVar33 != 0) {
                auVar113._8_4_ = auVar73._8_4_;
                auVar113._0_8_ = auVar73._0_8_;
                auVar113._12_4_ = auVar73._12_4_;
              }
              uVar54 = movmskps(uVar54,auVar113);
              lVar53 = 0;
              lVar43 = local_1218;
              fVar67 = fVar142;
              if (uVar54 != 0) {
                for (; (uVar54 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
LAB_00578e5e:
              uVar54 = *(uint *)((long)&local_f88 + lVar53 * 4);
              uVar37 = (ulong)uVar54;
              uVar44 = *(ulong *)(*(long *)(lVar43 + 0x1e8) + uVar37 * 8);
              if ((*(uint *)(uVar44 + 0x34) & (uint)fVar142) == 0) {
                *(undefined4 *)(local_11d8 + lVar53 * 4) = 0;
              }
              else {
                pbVar47 = *(byte **)&(local_1240->super_RayK<1>).dir.field_0;
                if (*(long *)(pbVar47 + 0x10) == 0) {
                  puVar35 = *(uint **)((long)&(local_1240->super_RayK<1>).org.field_0 + 8);
                  if (*(long *)(uVar44 + 0x40) == 0) {
                    uVar38 = *(undefined4 *)(local_1078 + lVar53 * 4);
                    fVar67 = local_1058[lVar53 + -4];
                    *(float *)&(This->intersector1).intersect = local_1058[lVar53];
                    *(float *)&(This->intersector1).pointQuery = local_1048[lVar53];
                    *(float *)((long)&(This->intersector1).pointQuery + 4) = local_1038[lVar53];
                    *(float *)&(This->intersector1).name = local_1028[lVar53];
                    *(undefined4 *)((long)&(This->intersector1).name + 4) = uVar38;
                    *(float *)&(This->intersector4).intersect = fVar67;
                    *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                         *(undefined4 *)((long)&local_10d8 + lVar53 * 4);
                    *(uint *)&(This->intersector4).occluded = uVar54;
                    context = (RayQueryContext *)(ulong)*puVar35;
                    *(uint *)((long)&(This->intersector4).occluded + 4) = *puVar35;
                    *(uint *)&(This->intersector4).name = puVar35[1];
                    goto LAB_0057918b;
                  }
                }
                else {
                  puVar35 = *(uint **)((long)&(local_1240->super_RayK<1>).org.field_0 + 8);
                }
                local_1128 = local_1048[lVar53];
                local_1124 = local_1038[lVar53];
                local_1120 = local_1028[lVar53];
                local_111c = *(undefined4 *)(local_1078 + lVar53 * 4);
                local_1118 = local_1058[lVar53 + -4];
                local_1114 = *(undefined4 *)((long)&local_10d8 + lVar53 * 4);
                local_1110 = uVar54;
                local_110c = *puVar35;
                local_1108 = puVar35[1];
                *(float *)&(This->intersector1).intersect = local_1058[lVar53];
                local_120c = -1;
                local_1158 = &local_120c;
                uVar37 = *(ulong *)(uVar44 + 0x18);
                local_1150 = uVar37;
                local_1148 = puVar35;
                local_1140 = This;
                local_1138 = &local_1128;
                local_1130 = 1;
                local_11e8 = uVar44;
                local_1278._4_4_ = fVar83;
                local_1278._0_4_ = fVar152;
                fStack_1270 = fVar91;
                fStack_126c = fVar92;
                fStack_1254 = fVar67;
                fStack_1250 = fVar153;
                fStack_124c = fVar75;
                if (*(code **)(uVar44 + 0x40) == (code *)0x0) {
LAB_0057903a:
                  if ((*(code **)(pbVar47 + 0x10) != (code *)0x0) &&
                     (((*pbVar47 & 2) != 0 ||
                      (uVar37 = local_11e8, (*(byte *)(local_11e8 + 0x3e) & 0x40) != 0)))) {
                    (**(code **)(pbVar47 + 0x10))(&local_1158);
                    This = local_1220;
                    lVar43 = local_1218;
                    fVar152 = (float)local_1278._0_4_;
                    fVar83 = (float)local_1278._4_4_;
                    fVar91 = fStack_1270;
                    fVar92 = fStack_126c;
                    if (*local_1158 == 0) goto LAB_005790d8;
                  }
                  *(float *)&(local_1140->intersector1).pointQuery = *local_1138;
                  *(float *)((long)&(local_1140->intersector1).pointQuery + 4) = local_1138[1];
                  *(float *)&(local_1140->intersector1).name = local_1138[2];
                  *(float *)((long)&(local_1140->intersector1).name + 4) = local_1138[3];
                  *(float *)&(local_1140->intersector4).intersect = local_1138[4];
                  *(float *)((long)&(local_1140->intersector4).intersect + 4) = local_1138[5];
                  *(float *)&(local_1140->intersector4).occluded = local_1138[6];
                  *(float *)((long)&(local_1140->intersector4).occluded + 4) = local_1138[7];
                  uVar37 = (ulong)(uint)local_1138[8];
                  *(float *)&(local_1140->intersector4).name = local_1138[8];
                }
                else {
                  local_1238._0_8_ = pbVar47;
                  (**(code **)(uVar44 + 0x40))(&local_1158);
                  This = local_1220;
                  lVar43 = local_1218;
                  pbVar47 = (byte *)local_1238._0_8_;
                  fVar152 = (float)local_1278._0_4_;
                  fVar83 = (float)local_1278._4_4_;
                  fVar91 = fStack_1270;
                  fVar92 = fStack_126c;
                  if (*local_1158 != 0) goto LAB_0057903a;
LAB_005790d8:
                  *(float *)&(local_1220->intersector1).intersect = local_1258;
                  This = local_1220;
                  lVar43 = local_1218;
                }
                *(undefined4 *)(local_11d8 + lVar53 * 4) = 0;
                local_1258 = *(float *)&(This->intersector1).intersect;
                fVar67 = *(float *)((long)&(This->intersector1).intersect + 4);
                fVar153 = *(float *)&(This->intersector1).occluded;
                fVar75 = *(float *)((long)&(This->intersector1).occluded + 4);
                local_11d8._0_4_ = -(uint)(fVar152 <= local_1258) & local_11d8._0_4_;
                local_11d8._4_4_ = -(uint)(fVar83 <= local_1258) & local_11d8._4_4_;
                uStack_11d0 = -(uint)(fVar91 <= local_1258) & uStack_11d0;
                uStack_11cc = -(uint)(fVar92 <= local_1258) & uStack_11cc;
                fVar142 = *(float *)((long)&(This->intersector1).intersect + 4);
              }
              uVar38 = (undefined4)(uVar37 >> 0x20);
              iVar33 = movmskps((int)uVar37,_local_11d8);
              context = (RayQueryContext *)CONCAT44(uVar38,iVar33);
              if (iVar33 == 0) goto LAB_0057918b;
              uVar54 = local_11d8._0_4_;
              uVar56 = local_11d8._4_4_;
              uVar60 = local_11d8._8_4_;
              uVar55 = local_11d8._12_4_;
              auVar80._0_4_ = uVar54 & (uint)fVar152;
              auVar80._4_4_ = uVar56 & (uint)fVar83;
              auVar80._8_4_ = uVar60 & (uint)fVar91;
              auVar80._12_4_ = uVar55 & (uint)fVar92;
              auVar90._0_8_ = CONCAT44(~uVar56,~uVar54) & 0x7f8000007f800000;
              auVar90._8_4_ = ~uVar60 & 0x7f800000;
              auVar90._12_4_ = ~uVar55 & 0x7f800000;
              auVar90 = auVar90 | auVar80;
              auVar97._4_4_ = auVar90._0_4_;
              auVar97._0_4_ = auVar90._4_4_;
              auVar97._8_4_ = auVar90._12_4_;
              auVar97._12_4_ = auVar90._8_4_;
              auVar105 = minps(auVar97,auVar90);
              auVar81._0_8_ = auVar105._8_8_;
              auVar81._8_4_ = auVar105._0_4_;
              auVar81._12_4_ = auVar105._4_4_;
              auVar105 = minps(auVar81,auVar105);
              auVar82._0_8_ =
                   CONCAT44(-(uint)(auVar105._4_4_ == auVar90._4_4_) & uVar56,
                            -(uint)(auVar105._0_4_ == auVar90._0_4_) & uVar54);
              auVar82._8_4_ = -(uint)(auVar105._8_4_ == auVar90._8_4_) & uVar60;
              auVar82._12_4_ = -(uint)(auVar105._12_4_ == auVar90._12_4_) & uVar55;
              iVar33 = movmskps(iVar33,auVar82);
              auVar74 = _local_11d8;
              if (iVar33 != 0) {
                auVar74._8_4_ = auVar82._8_4_;
                auVar74._0_8_ = auVar82._0_8_;
                auVar74._12_4_ = auVar82._12_4_;
              }
              uVar36 = movmskps(iVar33,auVar74);
              uVar44 = CONCAT44(uVar38,uVar36);
              lVar53 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
              goto LAB_00578e5e;
            }
          }
LAB_0057918b:
          uVar44 = local_1260;
          uVar37 = local_1178;
          auVar105 = local_fb8;
          fVar130 = local_ff8;
          fVar67 = fStack_ff4;
          fVar75 = fStack_ff0;
          fVar147 = fStack_fec;
          fVar152 = local_1008;
          fVar83 = fStack_1004;
          fVar91 = fStack_1000;
          fVar92 = fStack_ffc;
          fVar155 = local_10e8;
          fVar93 = fStack_10e4;
          fVar98 = fStack_10e0;
          fVar99 = fStack_10dc;
          fVar145 = local_10f8;
          fVar100 = fStack_10f4;
          fVar101 = fStack_10f0;
          fVar102 = fStack_10ec;
          fVar159 = local_fa8;
          fVar103 = fStack_fa4;
          fVar104 = fStack_fa0;
          fVar114 = fStack_f9c;
          fVar149 = local_fc8;
          fVar115 = fStack_fc4;
          fVar116 = fStack_fc0;
          fVar117 = fStack_fbc;
          fVar157 = local_fd8;
          fVar118 = fStack_fd4;
          fVar119 = fStack_fd0;
          fVar123 = fStack_fcc;
          fVar142 = local_fe8;
          fVar128 = fStack_fe4;
          fVar129 = fStack_fe0;
          fVar131 = fStack_fdc;
        }
        fVar153 = *(float *)&(This->intersector1).intersect;
        auVar88._4_4_ = fVar153;
        auVar88._0_4_ = fVar153;
        auVar88._8_4_ = fVar153;
        auVar88._12_4_ = fVar153;
      }
      goto LAB_005781b3;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }